

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 05_algorithm.cc
# Opt level: O0

int main(void)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  ostream *poVar1;
  keeper<ezy::experimental::reference_category_tag,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ranges_1;
  iterate_view<int,_ezy::detail::increment> iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *separator;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *range0;
  result_range_type rVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_228;
  int local_1c4;
  remove_cvref_t<int> local_1c0 [2];
  ResultRangeType_conflict local_1b8;
  ResultRangeType local_198;
  anon_class_1_0_00000001 local_171;
  keeper<ezy::experimental::reference_category_tag,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  kStack_170;
  anon_class_1_0_00000001 print_with_number;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  anon_class_1_0_00000001 local_139;
  undefined1 local_138 [7];
  anon_class_1_0_00000001 quote;
  undefined1 local_118 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  long_words;
  allocator<char> local_f8;
  allocator<char> local_f7;
  allocator<char> local_f6;
  allocator<char> local_f5 [20];
  allocator<char> local_e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  
  words.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  long_words.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  local_e0 = &local_d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"a",&local_e1);
  local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b8,"bb",local_f5);
  local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_98,"looong",&local_f6);
  local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_78,"looooong",&local_f7);
  local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,"with, comma, and, space",&local_f8);
  long_words.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  local_38 = &local_d8;
  local_30 = 5;
  this = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)((long)&long_words.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 6);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(this);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_28,__l,this);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&long_words.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  separator = &local_d8;
  local_228 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_38;
  do {
    local_228 = local_228 + -1;
    std::__cxx11::string::~string((string *)local_228);
  } while (local_228 != separator);
  std::allocator<char>::~allocator(&local_f8);
  std::allocator<char>::~allocator(&local_f7);
  std::allocator<char>::~allocator(&local_f6);
  std::allocator<char>::~allocator(local_f5);
  std::allocator<char>::~allocator(&local_e1);
  get_words_longer_than
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_118,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_28,3);
  ezy::
  join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,char_const(&)[3]>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
             (ezy *)local_118,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)", ",(char (*) [3])separator);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)local_138);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)local_138);
  rVar3 = ezy::
          transform<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,main::__0&>
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_118,&local_139);
  ranges_1 = rVar3.orig_range.t;
  kStack_170.t = ranges_1.t;
  ezy::
  join<ezy::detail::range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const>,main::__0&>,char_const(&)[3]>
            (&local_160,(ezy *)&stack0xfffffffffffffe90,
             (range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_titapo[P]ezy_examples_tutorial_05_algorithm_cc:21:16)_&>
              *)", ",(char (*) [3])ranges_1.t);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_160);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_160);
  ezy::enumerate<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>
            (&local_198,(ezy *)local_118,range0);
  ezy::
  for_each<ezy::detail::zip_range_view<ezy::make_tuple_fn,ezy::experimental::keeper<ezy::experimental::owner_category_tag,ezy::detail::iterate_view<unsigned_long,ezy::detail::increment>>,ezy::experimental::keeper<ezy::experimental::reference_category_tag,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const>>,main::__1_const&>
            (&local_198,&local_171);
  local_1c4 = 1;
  iVar2 = ezy::iterate<int>(&local_1c4);
  local_1c0[0] = iVar2.init;
  ezy::
  zip<ezy::detail::iterate_view<int,ezy::detail::increment>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>
            (&local_1b8,(ezy *)local_1c0,(iterate_view<int,_ezy::detail::increment> *)local_118,
             ranges_1.t);
  ezy::
  for_each<ezy::detail::zip_range_view<ezy::make_tuple_fn,ezy::experimental::keeper<ezy::experimental::owner_category_tag,ezy::detail::iterate_view<int,ezy::detail::increment>>,ezy::experimental::keeper<ezy::experimental::reference_category_tag,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const>>,main::__1_const&>
            (&local_1b8,&local_171);
  words.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 4;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_118);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_28);
  return words.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
}

Assistant:

int main()
{
  const std::vector<std::string> words{"a", "bb", "looong", "looooong", "with, comma, and, space"};
  const auto long_words = get_words_longer_than(words, 3);
  std::cout << ezy::join(long_words, ", ") << "\n";

  auto quote = [](const std::string &s) { return std::string() + "\"" + s + "\""; };
  std::cout << ezy::join(ezy::transform(long_words, quote), ", ") << "\n";

  //
  const auto print_with_number = [](const auto& element)
  {
    const auto& [i, word] = element;
    std::cout << i << ". " << word << "\n";
  };

  ezy::for_each(ezy::enumerate(long_words), print_with_number);

  ezy::for_each(ezy::zip(ezy::iterate(1), long_words), print_with_number);
  return 4;
}